

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O0

int test_crop_4(void)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  Mat *in_stack_00000258;
  Mat *in_stack_00000260;
  Mat *in_stack_00000268;
  Mat *in_stack_00000270;
  Mat a;
  int in_stack_fffffffffffff8ec;
  int in_stack_fffffffffffff8f4;
  int in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff8fc;
  uint a0;
  uint in_stack_fffffffffffff904;
  int in_stack_fffffffffffff908;
  int in_stack_fffffffffffff90c;
  
  RandomMat(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f4);
  bVar20 = false;
  bVar19 = false;
  bVar18 = false;
  bVar17 = false;
  bVar16 = false;
  bVar15 = false;
  bVar14 = false;
  bVar13 = false;
  bVar12 = false;
  bVar11 = false;
  bVar10 = false;
  bVar9 = false;
  bVar8 = false;
  bVar7 = false;
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  in_stack_fffffffffffff904 = in_stack_fffffffffffff904 & 0xffffff;
  IntArrayMat(in_stack_fffffffffffff90c,in_stack_fffffffffffff908,in_stack_fffffffffffff904);
  IntArrayMat(in_stack_fffffffffffff90c,in_stack_fffffffffffff908,in_stack_fffffffffffff904);
  IntArrayMat(in_stack_fffffffffffff90c,in_stack_fffffffffffff908,in_stack_fffffffffffff904);
  iVar21 = test_crop(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
  a0 = CONCAT13(1,(int3)in_stack_fffffffffffff8fc);
  if (iVar21 == 0) {
    IntArrayMat(in_stack_fffffffffffff8ec);
    bVar20 = true;
    IntArrayMat(in_stack_fffffffffffff8ec);
    bVar19 = true;
    IntArrayMat(in_stack_fffffffffffff8ec);
    bVar18 = true;
    iVar21 = test_crop(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
    a0 = CONCAT13(1,(int3)a0);
    if (iVar21 == 0) {
      IntArrayMat(in_stack_fffffffffffff8ec);
      bVar17 = true;
      IntArrayMat(in_stack_fffffffffffff8ec);
      bVar16 = true;
      IntArrayMat(in_stack_fffffffffffff8ec);
      bVar15 = true;
      iVar22 = test_crop(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
      a0 = CONCAT13(1,(int3)a0);
      if (iVar22 == 0) {
        IntArrayMat(in_stack_fffffffffffff8ec);
        bVar14 = true;
        IntArrayMat(in_stack_fffffffffffff8ec);
        bVar13 = true;
        IntArrayMat(in_stack_fffffffffffff8ec);
        bVar12 = true;
        iVar22 = test_crop(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258);
        a0 = CONCAT13(1,(int3)a0);
        if (iVar22 == 0) {
          IntArrayMat(a0,iVar21);
          bVar11 = true;
          IntArrayMat(a0,iVar21);
          bVar10 = true;
          IntArrayMat(a0,iVar21);
          bVar9 = true;
          iVar22 = test_crop(in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258
                            );
          a0 = CONCAT13(1,(int3)a0);
          if (iVar22 == 0) {
            IntArrayMat(a0,iVar21);
            bVar8 = true;
            IntArrayMat(a0,iVar21);
            bVar7 = true;
            IntArrayMat(a0,iVar21);
            bVar6 = true;
            iVar22 = test_crop(in_stack_00000270,in_stack_00000268,in_stack_00000260,
                               in_stack_00000258);
            a0 = CONCAT13(1,(int3)a0);
            if (iVar22 == 0) {
              IntArrayMat(a0,iVar21);
              bVar5 = true;
              IntArrayMat(a0,iVar21);
              bVar4 = true;
              IntArrayMat(a0,iVar21);
              bVar3 = true;
              iVar21 = test_crop(in_stack_00000270,in_stack_00000268,in_stack_00000260,
                                 in_stack_00000258);
              a0 = 0x1000000;
              if (iVar21 == 0) {
                IntArrayMat(in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                            in_stack_fffffffffffff904);
                bVar2 = true;
                IntArrayMat(in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                            in_stack_fffffffffffff904);
                bVar1 = true;
                IntArrayMat(in_stack_fffffffffffff90c,in_stack_fffffffffffff908,
                            in_stack_fffffffffffff904);
                in_stack_fffffffffffff904 = 0x1000000;
                iVar21 = test_crop(in_stack_00000270,in_stack_00000268,in_stack_00000260,
                                   in_stack_00000258);
                a0 = (uint)(iVar21 != 0) << 0x18;
              }
            }
          }
        }
      }
    }
  }
  if ((in_stack_fffffffffffff904 & 0x1000000) != 0) {
    ncnn::Mat::~Mat((Mat *)0x1181da);
  }
  if (bVar1) {
    ncnn::Mat::~Mat((Mat *)0x1181ed);
  }
  if (bVar2) {
    ncnn::Mat::~Mat((Mat *)0x118206);
  }
  if (bVar3) {
    ncnn::Mat::~Mat((Mat *)0x11821f);
  }
  if (bVar4) {
    ncnn::Mat::~Mat((Mat *)0x118238);
  }
  if (bVar5) {
    ncnn::Mat::~Mat((Mat *)0x118251);
  }
  if (bVar6) {
    ncnn::Mat::~Mat((Mat *)0x11826a);
  }
  if (bVar7) {
    ncnn::Mat::~Mat((Mat *)0x118283);
  }
  if (bVar8) {
    ncnn::Mat::~Mat((Mat *)0x11829c);
  }
  if (bVar9) {
    ncnn::Mat::~Mat((Mat *)0x1182b5);
  }
  if (bVar10) {
    ncnn::Mat::~Mat((Mat *)0x1182ce);
  }
  if (bVar11) {
    ncnn::Mat::~Mat((Mat *)0x1182e7);
  }
  if (bVar12) {
    ncnn::Mat::~Mat((Mat *)0x118300);
  }
  if (bVar13) {
    ncnn::Mat::~Mat((Mat *)0x118319);
  }
  if (bVar14) {
    ncnn::Mat::~Mat((Mat *)0x118332);
  }
  if (bVar15) {
    ncnn::Mat::~Mat((Mat *)0x11834b);
  }
  if (bVar16) {
    ncnn::Mat::~Mat((Mat *)0x118364);
  }
  if (bVar17) {
    ncnn::Mat::~Mat((Mat *)0x11837d);
  }
  if (bVar18) {
    ncnn::Mat::~Mat((Mat *)0x118396);
  }
  if (bVar19) {
    ncnn::Mat::~Mat((Mat *)0x1183af);
  }
  if (bVar20) {
    ncnn::Mat::~Mat((Mat *)0x1183c8);
  }
  ncnn::Mat::~Mat((Mat *)0x1183d5);
  ncnn::Mat::~Mat((Mat *)0x1183e2);
  ncnn::Mat::~Mat((Mat *)0x1183ef);
  ncnn::Mat::~Mat((Mat *)0x1183fc);
  return a0 >> 0x18;
}

Assistant:

static int test_crop_4()
{
    ncnn::Mat a = RandomMat(13, 11, 17);

    return 0
        || test_crop(a, IntArrayMat(0, 0, 0), IntArrayMat(100, 100, 100), IntArrayMat(0, 1, 2))
        || test_crop(a, IntArrayMat(4), IntArrayMat(8), IntArrayMat(0))
        || test_crop(a, IntArrayMat(2), IntArrayMat(7), IntArrayMat(1))
        || test_crop(a, IntArrayMat(3), IntArrayMat(5), IntArrayMat(2))
        || test_crop(a, IntArrayMat(2, 1), IntArrayMat(4, -2), IntArrayMat(0, 1))
        || test_crop(a, IntArrayMat(1, 4), IntArrayMat(-5, 7), IntArrayMat(1, -3))
        || test_crop(a, IntArrayMat(2, 1), IntArrayMat(4, -2), IntArrayMat(-1, -2))
        || test_crop(a, IntArrayMat(1, 2, 3), IntArrayMat(-3, -2, -1), IntArrayMat(-3, -2, -1))
        ;
}